

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae21a::AssertionEmitter::fixCalls
          (AssertionEmitter *this,Ref asmjs,Name asmModule)

{
  Ref obj;
  Name asmModule_00;
  Name asmModule_01;
  Name asmModule_02;
  Name asmModule_03;
  bool bVar1;
  Value *pVVar2;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_00;
  size_t sVar3;
  IString *pIVar4;
  Ref this_01;
  Value *this_02;
  ArrayStorage *a;
  Assign *pAVar5;
  AssignName *this_03;
  Ref *pRVar6;
  ValueBuilder *this_04;
  char *extraout_RDX;
  IString key;
  IString name;
  bool local_149;
  Ref local_d0;
  Ref fixed;
  IString local_b8;
  IString local_a8;
  IString local_98;
  IString local_88;
  ValueBuilder *local_78;
  size_t local_70;
  Value *local_68;
  Ref *local_60;
  Ref *r;
  Iterator __end2;
  Iterator __begin2;
  ArrayStorage *__range2;
  ArrayStorage *arr;
  AssertionEmitter *this_local;
  Name asmModule_local;
  Ref asmjs_local;
  
  asmModule_local.super_IString.str._M_len = asmModule.super_IString.str._M_str;
  this_04 = asmModule.super_IString.str._M_len;
  asmModule_local.super_IString.str._M_str = (char *)asmjs.inst;
  pVVar2 = cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
  bVar1 = cashew::Value::isArray(pVVar2);
  if (bVar1) {
    pVVar2 = cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
    this_00 = &cashew::Value::getArray(pVVar2)->
               super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>;
    join_0x00000010_0x00000000_ = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::begin(this_00)
    ;
    _r = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::end(this_00);
    while (bVar1 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::Iterator::operator!=
                             ((Iterator *)&__end2.index,(Iterator *)&r), bVar1) {
      local_60 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::Iterator::operator*
                           ((Iterator *)&__end2.index);
      local_68 = local_60->inst;
      local_70 = asmModule_local.super_IString.str._M_len;
      asmModule_03.super_IString.str._M_str = (char *)asmModule_local.super_IString.str._M_len;
      asmModule_03.super_IString.str._M_len = (size_t)this_04;
      local_78 = this_04;
      fixCalls(this,(Ref)local_68,asmModule_03);
      ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
    sVar3 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::size(this_00);
    if (sVar3 != 0) {
      pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,0);
      pVVar2 = cashew::Ref::operator->(pRVar6);
      bVar1 = cashew::Value::isString(pVVar2);
      if (bVar1) {
        pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,0);
        pVVar2 = cashew::Ref::operator->(pRVar6);
        pIVar4 = cashew::Value::getIString(pVVar2);
        bVar1 = ::wasm::IString::operator==(pIVar4,(IString *)&cashew::CALL);
        if (bVar1) {
          sVar3 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::size(this_00);
          if (sVar3 < 2) {
            __assert_fail("arr.size() >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm2js.cpp"
                          ,0x2fd,"void (anonymous namespace)::AssertionEmitter::fixCalls(Ref, Name)"
                         );
          }
          pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
          pVVar2 = cashew::Ref::operator->(pRVar6);
          pIVar4 = cashew::Value::getIString(pVVar2);
          ::wasm::IString::IString(&local_88,"f32Equal");
          bVar1 = ::wasm::IString::operator==(pIVar4,&local_88);
          local_149 = true;
          if (!bVar1) {
            pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
            pVVar2 = cashew::Ref::operator->(pRVar6);
            pIVar4 = cashew::Value::getIString(pVVar2);
            ::wasm::IString::IString(&local_98,"f64Equal");
            bVar1 = ::wasm::IString::operator==(pIVar4,&local_98);
            local_149 = true;
            if (!bVar1) {
              pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
              pVVar2 = cashew::Ref::operator->(pRVar6);
              pIVar4 = cashew::Value::getIString(pVVar2);
              ::wasm::IString::IString(&local_a8,"i64Equal");
              bVar1 = ::wasm::IString::operator==(pIVar4,&local_a8);
              local_149 = true;
              if (!bVar1) {
                pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
                pVVar2 = cashew::Ref::operator->(pRVar6);
                pIVar4 = cashew::Value::getIString(pVVar2);
                ::wasm::IString::IString(&local_b8,"isNaN");
                local_149 = ::wasm::IString::operator==(pIVar4,&local_b8);
              }
            }
          }
          if (local_149 == false) {
            pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
            pVVar2 = cashew::Ref::operator->(pRVar6);
            pIVar4 = cashew::Value::getIString(pVVar2);
            ::wasm::IString::IString((IString *)&fixed,"Math_fround");
            bVar1 = ::wasm::IString::operator==(pIVar4,(IString *)&fixed);
            if (bVar1) {
              pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
              pVVar2 = cashew::Ref::operator->(pRVar6);
              cashew::Value::setString(pVVar2,"Math.fround");
            }
            else {
              name.str._M_str = extraout_RDX;
              name.str._M_len = asmModule_local.super_IString.str._M_len;
              this_01 = cashew::ValueBuilder::makeName(this_04,name);
              pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
              pVVar2 = cashew::Ref::operator->(pRVar6);
              pIVar4 = cashew::Value::getIString(pVVar2);
              obj.inst = (Value *)(pIVar4->str)._M_len;
              key.str._M_str = (char *)obj.inst;
              key.str._M_len = (size_t)(pIVar4->str)._M_str;
              local_d0 = cashew::ValueBuilder::makeDot(this_01.inst,obj,key);
              pRVar6 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[](this_00,1);
              pVVar2 = cashew::Ref::operator->(pRVar6);
              this_02 = cashew::Ref::operator->(&local_d0);
              a = cashew::Value::getArray(this_02);
              cashew::Value::setArray(pVVar2,a);
            }
          }
        }
      }
    }
  }
  pVVar2 = cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
  bVar1 = cashew::Value::isAssign(pVVar2);
  if (bVar1) {
    cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
    pAVar5 = (Assign *)cashew::Value::asAssign();
    pRVar6 = cashew::Assign::target(pAVar5);
    asmModule_02.super_IString.str._M_str = (char *)asmModule_local.super_IString.str._M_len;
    asmModule_02.super_IString.str._M_len = (size_t)this_04;
    fixCalls(this,pRVar6->inst,asmModule_02);
    cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
    pAVar5 = (Assign *)cashew::Value::asAssign();
    pRVar6 = cashew::Assign::value(pAVar5);
    asmModule_01.super_IString.str._M_str = (char *)asmModule_local.super_IString.str._M_len;
    asmModule_01.super_IString.str._M_len = (size_t)this_04;
    fixCalls(this,pRVar6->inst,asmModule_01);
  }
  pVVar2 = cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
  bVar1 = cashew::Value::isAssignName(pVVar2);
  if (bVar1) {
    cashew::Ref::operator->((Ref *)&asmModule_local.super_IString.str._M_str);
    this_03 = (AssignName *)cashew::Value::asAssignName();
    pRVar6 = cashew::AssignName::value(this_03);
    asmModule_00.super_IString.str._M_str = (char *)asmModule_local.super_IString.str._M_len;
    asmModule_00.super_IString.str._M_len = (size_t)this_04;
    fixCalls(this,pRVar6->inst,asmModule_00);
  }
  return;
}

Assistant:

void AssertionEmitter::fixCalls(Ref asmjs, Name asmModule) {
  if (asmjs->isArray()) {
    ArrayStorage& arr = asmjs->getArray();
    for (Ref& r : arr) {
      fixCalls(r, asmModule);
    }
    if (arr.size() > 0 && arr[0]->isString() &&
        arr[0]->getIString() == cashew::CALL) {
      assert(arr.size() >= 2);
      if (arr[1]->getIString() == "f32Equal" ||
          arr[1]->getIString() == "f64Equal" ||
          arr[1]->getIString() == "i64Equal" ||
          arr[1]->getIString() == "isNaN") {
        // ...
      } else if (arr[1]->getIString() == "Math_fround") {
        arr[1]->setString("Math.fround");
      } else {
        Ref fixed = ValueBuilder::makeDot(ValueBuilder::makeName(asmModule),
                                          arr[1]->getIString());
        arr[1]->setArray(fixed->getArray());
      }
    }
  }

  if (asmjs->isAssign()) {
    fixCalls(asmjs->asAssign()->target(), asmModule);
    fixCalls(asmjs->asAssign()->value(), asmModule);
  }
  if (asmjs->isAssignName()) {
    fixCalls(asmjs->asAssignName()->value(), asmModule);
  }
}